

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow-c.cpp
# Opt level: O3

idx_t duckdb_arrow_rows_changed(duckdb_arrow result)

{
  bool bVar1;
  pointer pMVar2;
  ColumnDataCollection *this;
  ColumnDataRow *this_00;
  int64_t val;
  unsigned_long uVar3;
  ColumnDataRowCollection rows;
  Value local_100;
  ColumnDataRowCollection local_c0;
  
  pMVar2 = duckdb::
           unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
           ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                         *)result);
  bVar1 = duckdb::BaseQueryResult::HasError((BaseQueryResult *)pMVar2);
  if (!bVar1) {
    pMVar2 = duckdb::
             unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
             ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                           *)result);
    this = duckdb::MaterializedQueryResult::Collection(pMVar2);
    if ((this->count != 0) &&
       (pMVar2 = duckdb::
                 unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                 ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                               *)result),
       (pMVar2->super_QueryResult).super_BaseQueryResult.properties.return_type == CHANGED_ROWS)) {
      duckdb::ColumnDataCollection::GetRows(&local_c0,this);
      this_00 = duckdb::ColumnDataRowCollection::operator[](&local_c0,0);
      duckdb::ColumnDataRow::GetValue(&local_100,this_00,0);
      val = duckdb::Value::GetValue<long>(&local_100);
      uVar3 = duckdb::NumericCastImpl<unsigned_long,_long,_false>::Convert(val);
      duckdb::Value::~Value(&local_100);
      if (local_c0.scan_state.column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>
          .super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_c0.scan_state.column_ids.
                        super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)&local_c0.scan_state);
      std::
      vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
      ::~vector(&local_c0.chunks.
                 super_vector<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>_>_>
               );
      if (local_c0.rows.super_vector<duckdb::ColumnDataRow,_std::allocator<duckdb::ColumnDataRow>_>.
          super__Vector_base<duckdb::ColumnDataRow,_std::allocator<duckdb::ColumnDataRow>_>._M_impl.
          super__Vector_impl_data._M_start == (pointer)0x0) {
        return uVar3;
      }
      operator_delete(local_c0.rows.
                      super_vector<duckdb::ColumnDataRow,_std::allocator<duckdb::ColumnDataRow>_>.
                      super__Vector_base<duckdb::ColumnDataRow,_std::allocator<duckdb::ColumnDataRow>_>
                      ._M_impl.super__Vector_impl_data._M_start);
      return uVar3;
    }
  }
  return 0;
}

Assistant:

idx_t duckdb_arrow_rows_changed(duckdb_arrow result) {
	auto wrapper = reinterpret_cast<ArrowResultWrapper *>(result);
	if (wrapper->result->HasError()) {
		return 0;
	}
	idx_t rows_changed = 0;
	auto &collection = wrapper->result->Collection();
	idx_t row_count = collection.Count();
	if (row_count > 0 && wrapper->result->properties.return_type == duckdb::StatementReturnType::CHANGED_ROWS) {
		auto rows = collection.GetRows();
		D_ASSERT(row_count == 1);
		D_ASSERT(rows.size() == 1);
		rows_changed = duckdb::NumericCast<idx_t>(rows[0].GetValue(0).GetValue<int64_t>());
	}
	return rows_changed;
}